

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sreadrb.c
# Opt level: O0

void sreadrb(int *nrow,int *ncol,int_t *nonz,float **nzval,int_t **rowind,int_t **colptr)

{
  FILE *__stream;
  int iVar1;
  bool local_d9;
  FILE *fp;
  int sym;
  char type [4];
  char buf [100];
  int local_5c;
  int local_58;
  int valsize;
  int valnum;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  int tmp;
  int numer_lines;
  int i;
  int_t **colptr_local;
  int_t **rowind_local;
  float **nzval_local;
  int_t *nonz_local;
  int *ncol_local;
  int *nrow_local;
  
  __stream = _stdin;
  colnum = 0;
  _numer_lines = colptr;
  colptr_local = rowind;
  rowind_local = (int_t **)nzval;
  nzval_local = (float **)nonz;
  nonz_local = ncol;
  ncol_local = nrow;
  fgets((char *)&sym,100,_stdin);
  fputs((char *)&sym,_stdout);
  for (tmp = 0; tmp < 4; tmp = tmp + 1) {
    __isoc99_fscanf(__stream,"%14c",&sym);
    __isoc99_sscanf(&sym,"%d",&colsize);
    if (tmp == 3) {
      colnum = colsize;
    }
  }
  sDumpLine((FILE *)__stream);
  __isoc99_fscanf(__stream,"%3c",(long)&fp + 4);
  __isoc99_fscanf(__stream,"%11c",&sym);
  fp._7_1_ = 0;
  __isoc99_fscanf(__stream,"%14c",&sym);
  iVar1 = atoi((char *)&sym);
  *ncol_local = iVar1;
  __isoc99_fscanf(__stream,"%14c",&sym);
  iVar1 = atoi((char *)&sym);
  *nonz_local = iVar1;
  __isoc99_fscanf(__stream,"%14c",&sym);
  iVar1 = atoi((char *)&sym);
  *(int *)nzval_local = iVar1;
  __isoc99_fscanf(__stream,"%14c",&sym);
  colsize = atoi((char *)&sym);
  if (colsize != 0) {
    printf("This is not an assembled matrix!\n");
  }
  if (*ncol_local != *nonz_local) {
    printf("Matrix is not square.\n");
  }
  sDumpLine((FILE *)__stream);
  sallocateA(*nonz_local,*(int_t *)nzval_local,(float **)rowind_local,colptr_local,_numer_lines);
  __isoc99_fscanf(__stream,"%16c",&sym);
  sParseIntFormat((char *)&sym,&rownum,&rowsize);
  __isoc99_fscanf(__stream,"%16c",&sym);
  sParseIntFormat((char *)&sym,&valnum,&valsize);
  __isoc99_fscanf(__stream,"%20c",&sym);
  sParseFloatFormat((char *)&sym,&local_58,&local_5c);
  sDumpLine((FILE *)__stream);
  ReadVector((FILE *)__stream,*nonz_local + 1,*_numer_lines,rownum,rowsize);
  ReadVector((FILE *)__stream,*(int *)nzval_local,*colptr_local,valnum,valsize);
  if (colnum != 0) {
    sReadValues((FILE *)__stream,*(int *)nzval_local,(float *)*rowind_local,local_58,local_5c);
  }
  local_d9 = fp._5_1_ == 'S' || fp._5_1_ == 's';
  fp._0_4_ = (uint)local_d9;
  if ((uint)fp != 0) {
    FormFullA(*nonz_local,(int_t *)nzval_local,(float **)rowind_local,colptr_local,_numer_lines);
  }
  fclose(__stream);
  return;
}

Assistant:

void
sreadrb(int *nrow, int *ncol, int_t *nonz,
        float **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;
    FILE *fp;

    fp = stdin;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<4; i++) {
        fscanf(fp, "%14c", buf); buf[14] = 0;
        sscanf(buf, "%d", &tmp);
        if (i == 3) numer_lines = tmp;
    }
    sDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#ifdef DEBUG
    printf("Matrix type %s\n", type);
#endif

    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);

    if (tmp != 0)
        printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
        printf("Matrix is not square.\n");
    sDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    sallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    sParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    sParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    sParseFloatFormat(buf, &valnum, &valsize);
    sDumpLine(fp);

#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif

    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        sReadValues(fp, *nonz, *nzval, valnum, valsize);
    }

    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}